

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::
unordered_flat_map<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
::~unordered_flat_map
          (unordered_flat_map<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
           *this)

{
  value_type_pointer p;
  
  p = (this->table_).
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_slang::DiagnosticSeverity,_std::basic_string_view<char>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_slang::DiagnosticSeverity,_std::basic_string_view<char>_>_>_>_>
      .arrays.elements_;
  if (p != (value_type_pointer)0x0) {
    operator_delete(p,(this->table_).
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_slang::DiagnosticSeverity,_std::basic_string_view<char>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_slang::DiagnosticSeverity,_std::basic_string_view<char>_>_>_>_>
                      .arrays.groups_size_mask * 0x3d0 + 0x3d0 & 0xffffffffffffffc0);
    return;
  }
  return;
}

Assistant:

~unordered_flat_map() = default;